

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

uint32_t get_nfc(uint32_t uc,uint32_t uc2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0x3a2;
  iVar3 = 0;
  do {
    while( true ) {
      if (iVar2 < iVar3) {
        return 0;
      }
      iVar1 = (iVar2 + iVar3) / 2;
      if (uc <= u_composition_table[iVar1].cp1) break;
LAB_0014285a:
      iVar3 = iVar1 + 1;
    }
    if (u_composition_table[iVar1].cp1 <= uc) {
      if (u_composition_table[iVar1].cp2 < uc2) goto LAB_0014285a;
      if (u_composition_table[iVar1].cp2 <= uc2) {
        return u_composition_table[iVar1].nfc;
      }
    }
    iVar2 = iVar1 + -1;
  } while( true );
}

Assistant:

static uint32_t
get_nfc(uint32_t uc, uint32_t uc2)
{
	int t, b;

	t = 0;
	b = sizeof(u_composition_table)/sizeof(u_composition_table[0]) -1;
	while (b >= t) {
		int m = (t + b) / 2;
		if (u_composition_table[m].cp1 < uc)
			t = m + 1;
		else if (u_composition_table[m].cp1 > uc)
			b = m - 1;
		else if (u_composition_table[m].cp2 < uc2)
			t = m + 1;
		else if (u_composition_table[m].cp2 > uc2)
			b = m - 1;
		else
			return (u_composition_table[m].nfc);
	}
	return (0);
}